

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddIncludeDirectories
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *incs,bool before)

{
  bool bVar1;
  reference ppVar2;
  cmTarget *t;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  *target;
  iterator __end1;
  iterator __begin1;
  cmTargetMap *__range1;
  cmStateDirectory local_88;
  undefined1 local_50 [8];
  string entryString;
  cmListFileBacktrace lfbt;
  bool before_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *incs_local;
  cmMakefile *this_local;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(incs);
  if (!bVar1) {
    GetBacktrace((cmMakefile *)((long)&entryString.field_2 + 8));
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_50,incs,";");
    if (before) {
      cmStateSnapshot::GetDirectory(&local_88,&this->StateSnapshot);
      cmStateDirectory::PrependIncludeDirectoriesEntry
                (&local_88,(string *)local_50,
                 (cmListFileBacktrace *)((long)&entryString.field_2 + 8));
    }
    else {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&__range1,&this->StateSnapshot);
      cmStateDirectory::AppendIncludeDirectoriesEntry
                ((cmStateDirectory *)&__range1,(string *)local_50,
                 (cmListFileBacktrace *)((long)&entryString.field_2 + 8));
    }
    __end1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
             ::begin(&this->Targets);
    target = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
              *)std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                ::end(&this->Targets);
    while (bVar1 = std::__detail::operator!=
                             (&__end1.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                *)&target), bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
               ::operator*(&__end1);
      cmTarget::InsertInclude
                (&ppVar2->second,(string *)local_50,
                 (cmListFileBacktrace *)((long)&entryString.field_2 + 8),before);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++(&__end1);
    }
    std::__cxx11::string::~string((string *)local_50);
    cmListFileBacktrace::~cmListFileBacktrace
              ((cmListFileBacktrace *)((long)&entryString.field_2 + 8));
  }
  return;
}

Assistant:

void cmMakefile::AddIncludeDirectories(const std::vector<std::string>& incs,
                                       bool before)
{
  if (incs.empty()) {
    return;
  }

  cmListFileBacktrace lfbt = this->GetBacktrace();
  std::string entryString = cmJoin(incs, ";");
  if (before) {
    this->StateSnapshot.GetDirectory().PrependIncludeDirectoriesEntry(
      entryString, lfbt);
  } else {
    this->StateSnapshot.GetDirectory().AppendIncludeDirectoriesEntry(
      entryString, lfbt);
  }

  // Property on each target:
  for (auto& target : this->Targets) {
    cmTarget& t = target.second;
    t.InsertInclude(entryString, lfbt, before);
  }
}